

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int re_readpattern(char *re_prompt)

{
  int __errcode;
  char local_188 [8];
  char message [256];
  char *local_80;
  char *rep;
  char tpat [80];
  int s;
  int error;
  int flags;
  char *re_prompt_local;
  
  if (re_pat[0] == '\0') {
    local_80 = eread("%s: ",(char *)&rep,0x50,0x18,re_prompt);
  }
  else {
    local_80 = eread("%s (default %s): ",(char *)&rep,0x50,0x58,re_prompt,re_pat);
  }
  if (local_80 == (char *)0x0) {
    re_prompt_local._4_4_ = 2;
  }
  else {
    if (*local_80 == '\0') {
      if ((*local_80 == '\0') && (re_pat[0] != '\0')) {
        tpat[0x4c] = '\x01';
        tpat[0x4d] = '\0';
        tpat[0x4e] = '\0';
        tpat[0x4f] = '\0';
      }
      else {
        tpat[0x4c] = '\0';
        tpat[0x4d] = '\0';
        tpat[0x4e] = '\0';
        tpat[0x4f] = '\0';
      }
    }
    else {
      strlcpy(re_pat,&rep,0x50);
      if (casefoldsearch == 0) {
        s = 1;
      }
      else {
        s = 3;
      }
      if (re_readpattern::dofree != 0) {
        regfree((regex_t *)&regex_buff);
      }
      __errcode = regcomp((regex_t *)&regex_buff,re_pat,s);
      if (__errcode != 0) {
        regerror(__errcode,(regex_t *)&regex_buff,local_188,0x100);
        dobeep();
        ewprintf("Regex Error: %s",local_188);
        re_pat[0] = '\0';
        return 0;
      }
      re_readpattern::dofree = 1;
      tpat[0x4c] = '\x01';
      tpat[0x4d] = '\0';
      tpat[0x4e] = '\0';
      tpat[0x4f] = '\0';
    }
    re_prompt_local._4_1_ = tpat[0x4c];
    re_prompt_local._5_1_ = tpat[0x4d];
    re_prompt_local._6_1_ = tpat[0x4e];
    re_prompt_local._7_1_ = tpat[0x4f];
  }
  return re_prompt_local._4_4_;
}

Assistant:

static int
re_readpattern(char *re_prompt)
{
	static int	dofree = 0;
	int		flags, error, s;
	char		tpat[NPAT], *rep;

	if (re_pat[0] == '\0')
		rep = eread("%s: ", tpat, NPAT, EFNEW | EFCR, re_prompt);
	else
		rep = eread("%s (default %s): ", tpat, NPAT,
		    EFNUL | EFNEW | EFCR, re_prompt, re_pat);
	if (rep == NULL)
		return (ABORT);
	if (rep[0] != '\0') {
		/* New pattern given */
		(void)strlcpy(re_pat, tpat, sizeof(re_pat));
		if (casefoldsearch)
			flags = REG_EXTENDED | REG_ICASE;
		else
			flags = REG_EXTENDED;
		if (dofree)
			regfree(&regex_buff);
		error = regcomp(&regex_buff, re_pat, flags);
		if (error != 0) {
			char	message[256];
			regerror(error, &regex_buff, message, sizeof(message));
			dobeep();
			ewprintf("Regex Error: %s", message);
			re_pat[0] = '\0';
			return (FALSE);
		}
		dofree = 1;
		s = TRUE;
	} else if (rep[0] == '\0' && re_pat[0] != '\0')
		/* Just using old pattern */
		s = TRUE;
	else
		s = FALSE;
	return (s);
}